

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O3

err_t cmdStampSelfVal(void)

{
  octet *path;
  err_t eVar1;
  bool_t bVar2;
  size_t sVar3;
  octet *stamp;
  size_t count;
  size_t count_1;
  size_t local_38 [2];
  
  eVar1 = cmdSysModulePath((char *)0x0,local_38);
  if (eVar1 == 0) {
    sVar3 = strLen(".stamp");
    stamp = (octet *)blobCreate(local_38[0] + sVar3 + 0x14);
    if (stamp == (octet *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      path = stamp + 0x14;
      eVar1 = cmdSysModulePath((char *)path,local_38);
      if ((eVar1 == 0) && (eVar1 = cmdFileStamp(stamp,(char *)path,1), eVar1 == 0xffffffff)) {
        local_38[1] = 10;
        sVar3 = strLen((char *)path);
        strCopy((char *)(path + sVar3),".stamp");
        eVar1 = cmdFileReadAll(stamp + 10,local_38 + 1,(char *)path);
        if (eVar1 == 0) {
          bVar2 = memEq(stamp,stamp + 10,10);
          eVar1 = 0xd2;
          if (bVar2 != 0) {
            eVar1 = 0;
          }
        }
      }
      blobClose(stamp);
    }
  }
  return eVar1;
}

Assistant:

err_t cmdStampSelfVal()
{
	const char* ext = ".stamp";
	err_t code;
	size_t count;
	void* stack;
	octet* stamp;
	octet* stamp1;
	char* name;
	// определить длину имени исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, 10 + 10 + count + strLen(ext));
	ERR_CALL_CHECK(code);
	stamp = (octet*)stack;
	stamp1 = stamp + 10;
	name = (char*)(stamp1 + 10);
	// определить имя исполняемого модуля
	code = cmdSysModulePath(name, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить присоединенный штамп
	code = cmdFileStamp(stamp, name, TRUE);
	// в файле нет штампа?
	if (code == ERR_MAX)
	{
		size_t count = 10;
		// прочитать отсоединенный штамп
		strCopy(name + strLen(name), ext);
		code = cmdFileReadAll(stamp1, &count, name);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить отсоединенный штамп
		if (!memEq(stamp, stamp1, 10))
			code = ERR_FILE_STAMP;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}